

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethread.c
# Opt level: O0

int compute_num_enc_row_mt_workers(AV1_COMMON *cm,int max_threads)

{
  int iVar1;
  int iVar2;
  int in_ESI;
  AV1_COMMON *in_RDI;
  int num_sb_cols_in_tile;
  int num_sb_rows_in_tile;
  int col;
  int row;
  int total_num_threads_row_mt;
  int tile_rows;
  int tile_cols;
  TileInfo tile_info;
  undefined4 in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  int in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc4;
  int local_38;
  int local_34;
  int local_30;
  TileInfo local_24;
  int local_c;
  AV1_COMMON *local_8;
  
  iVar1 = (in_RDI->tiles).cols;
  iVar2 = (in_RDI->tiles).rows;
  local_30 = 0;
  local_c = in_ESI;
  local_8 = in_RDI;
  for (local_34 = 0; local_34 < iVar2; local_34 = local_34 + 1) {
    for (local_38 = 0; local_38 < iVar1; local_38 = local_38 + 1) {
      av1_tile_init((TileInfo *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                    (AV1_COMMON *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),0,
                    0x2599c2);
      in_stack_ffffffffffffffc4 = av1_get_sb_rows_in_tile(local_8,&local_24);
      in_stack_ffffffffffffffc0 = av1_get_sb_cols_in_tile(local_8,&local_24);
      in_stack_ffffffffffffffbc = in_stack_ffffffffffffffc4;
      if (in_stack_ffffffffffffffc0 + 1 >> 1 < in_stack_ffffffffffffffc4) {
        in_stack_ffffffffffffffbc = in_stack_ffffffffffffffc0 + 1 >> 1;
      }
      local_30 = in_stack_ffffffffffffffbc + local_30;
    }
  }
  if (local_c < local_30) {
    local_30 = local_c;
  }
  return local_30;
}

Assistant:

static inline int compute_num_enc_row_mt_workers(const AV1_COMMON *cm,
                                                 int max_threads) {
  TileInfo tile_info;
  const int tile_cols = cm->tiles.cols;
  const int tile_rows = cm->tiles.rows;
  int total_num_threads_row_mt = 0;
  for (int row = 0; row < tile_rows; row++) {
    for (int col = 0; col < tile_cols; col++) {
      av1_tile_init(&tile_info, cm, row, col);
      const int num_sb_rows_in_tile = av1_get_sb_rows_in_tile(cm, &tile_info);
      const int num_sb_cols_in_tile = av1_get_sb_cols_in_tile(cm, &tile_info);
      total_num_threads_row_mt +=
          AOMMIN((num_sb_cols_in_tile + 1) >> 1, num_sb_rows_in_tile);
    }
  }
  return AOMMIN(max_threads, total_num_threads_row_mt);
}